

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O3

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::Vector<double,_4U>_>::postCorrelate
          (TimeCorrFunc<OpenMD::Vector<double,_4U>_> *this)

{
  uint uVar1;
  int iVar2;
  pointer pVVar3;
  pointer piVar4;
  double dVar5;
  ulong uVar6;
  pointer pVVar7;
  long lVar8;
  undefined1 auVar9 [16];
  
  uVar1 = this->nTimeBins_;
  if ((ulong)uVar1 != 0) {
    pVVar3 = (this->histogram_).
             super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    pVVar7 = pVVar3;
    do {
      iVar2 = piVar4[uVar6];
      if (iVar2 < 1) {
        pVVar3[uVar6].data_[2] = 0.0;
        (pVVar3[uVar6].data_ + 2)[1] = 0.0;
        pVVar3[uVar6].data_[0] = 0.0;
        pVVar3[uVar6].data_[1] = 0.0;
      }
      else {
        dVar5 = (double)iVar2;
        lVar8 = 0;
        do {
          auVar9._8_4_ = SUB84(dVar5,0);
          auVar9._0_8_ = dVar5;
          auVar9._12_4_ = (int)((ulong)dVar5 >> 0x20);
          auVar9 = divpd(*(undefined1 (*) [16])(pVVar7->data_ + lVar8),auVar9);
          *(undefined1 (*) [16])(pVVar7->data_ + lVar8) = auVar9;
          lVar8 = lVar8 + 2;
        } while (lVar8 != 4);
      }
      uVar6 = uVar6 + 1;
      pVVar7 = pVVar7 + 1;
    } while (uVar6 != uVar1);
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::postCorrelate() {
    T zeroType(0.0);
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      if (count_[i] > 0) {
        histogram_[i] /= count_[i];
      } else {
        histogram_[i] = zeroType;
      }
    }
  }